

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceAABB.h
# Opt level: O0

void __thiscall IceMaths::AABB::Extend(AABB *this,Point *p)

{
  undefined1 local_b0 [8];
  Point Min;
  Point Max;
  Point *p_local;
  AABB *this_local;
  
  Min.y = (this->mCenter).x + (this->mExtents).x;
  Min.z = (this->mCenter).y + (this->mExtents).y;
  local_b0._0_4_ = (this->mCenter).x - (this->mExtents).x;
  local_b0._4_4_ = (this->mCenter).y - (this->mExtents).y;
  Min.x = (this->mCenter).z - (this->mExtents).z;
  if (Min.y < p->x) {
    Min.y = p->x;
  }
  if (p->x < (float)local_b0._0_4_) {
    local_b0._0_4_ = p->x;
  }
  if (Min.z < p->y) {
    Min.z = p->y;
  }
  if (p->y < (float)local_b0._4_4_) {
    local_b0._4_4_ = p->y;
  }
  if (p->z < Min.x) {
    Min.x = p->z;
  }
  SetMinMax(this,(Point *)local_b0,(Point *)&Min.y);
  return;
}

Assistant:

void		Extend(const Point& p)
									{
										Point Max = mCenter + mExtents;
										Point Min = mCenter - mExtents;

										if(p.x > Max.x)	Max.x = p.x;
										if(p.x < Min.x)	Min.x = p.x;

										if(p.y > Max.y)	Max.y = p.y;
										if(p.y < Min.y)	Min.y = p.y;

										if(p.z > Max.z)	Max.z = p.z;
										if(p.z < Min.z)	Min.z = p.z;

										SetMinMax(Min, Max);
									}